

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O3

void conn_close(conn_handle *conn)

{
  int *piVar1;
  
  piVar1 = (int *)conn->priv;
  conn_shutdown(conn);
  mutex_lock((mutex_handle *)(piVar1 + 0x24));
  piVar1[2] = -1;
  if (piVar1[1] != -1) {
    close(piVar1[1]);
    piVar1[1] = -1;
  }
  if (*piVar1 != -1) {
    close(*piVar1);
    *piVar1 = -1;
  }
  mutex_unlock((mutex_handle *)(piVar1 + 0x24));
  return;
}

Assistant:

void conn_close(struct conn_handle *conn)
{
	struct conn_priv *priv = conn->priv;

	/* First, shutdown any active connections */
	conn_shutdown(conn);

	/* Now that we know there will be no one blocking while
	 * holding the shared lock, we can get the exclusive lock
	 * and close the descriptors
	 */
	mutex_lock(&priv->mutex);

	priv->fd = INVALID_SOCKET;

	if (priv->conn_fd != INVALID_SOCKET) {
		closesocket(priv->conn_fd);
		priv->conn_fd = INVALID_SOCKET;
	}

	if (priv->sock_fd != INVALID_SOCKET) {
		closesocket(priv->sock_fd);
		priv->sock_fd = INVALID_SOCKET;
	}

	mutex_unlock(&priv->mutex);
}